

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O0

vector<void_*,_std::allocator<void_*>_> *
eglu::chooseConfigs(vector<void_*,_std::allocator<void_*>_> *__return_storage_ptr__,Library *egl,
                   EGLDisplay display,FilterList *filters)

{
  pointer this;
  bool bVar1;
  reference ppvVar2;
  __normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_> local_58;
  __normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_> local_50;
  const_iterator cfg;
  undefined1 local_40 [8];
  vector<void_*,_std::allocator<void_*>_> allConfigs;
  FilterList *filters_local;
  EGLDisplay display_local;
  Library *egl_local;
  vector<void_*,_std::allocator<void_*>_> *matchingConfigs;
  
  allConfigs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)filters;
  getConfigs((vector<void_*,_std::allocator<void_*>_> *)local_40,egl,display);
  cfg._M_current._7_1_ = 0;
  std::vector<void_*,_std::allocator<void_*>_>::vector(__return_storage_ptr__);
  local_50._M_current =
       (void **)std::vector<void_*,_std::allocator<void_*>_>::begin
                          ((vector<void_*,_std::allocator<void_*>_> *)local_40);
  while( true ) {
    local_58._M_current =
         (void **)std::vector<void_*,_std::allocator<void_*>_>::end
                            ((vector<void_*,_std::allocator<void_*>_> *)local_40);
    bVar1 = __gnu_cxx::operator!=(&local_50,&local_58);
    this = allConfigs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
    if (!bVar1) break;
    ppvVar2 = __gnu_cxx::
              __normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_>::
              operator*(&local_50);
    bVar1 = FilterList::match((FilterList *)this,egl,display,*ppvVar2);
    if (bVar1) {
      ppvVar2 = __gnu_cxx::
                __normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_>::
                operator*(&local_50);
      std::vector<void_*,_std::allocator<void_*>_>::push_back(__return_storage_ptr__,ppvVar2);
    }
    __gnu_cxx::__normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_>::
    operator++(&local_50);
  }
  cfg._M_current._7_1_ = 1;
  std::vector<void_*,_std::allocator<void_*>_>::~vector
            ((vector<void_*,_std::allocator<void_*>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

vector<EGLConfig> chooseConfigs (const Library& egl, EGLDisplay display, const FilterList& filters)
{
	const vector<EGLConfig>	allConfigs		(getConfigs(egl, display));
	vector<EGLConfig>		matchingConfigs;

	for (vector<EGLConfig>::const_iterator cfg = allConfigs.begin(); cfg != allConfigs.end(); ++cfg)
	{
		if (filters.match(egl, display, *cfg))
			matchingConfigs.push_back(*cfg);
	}

	return matchingConfigs;
}